

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_cparse.c
# Opt level: O0

CTypeID cp_struct_name(CPState *cp,CPDecl *sdecl,CTInfo info)

{
  GCstr *local_38;
  CType *ct;
  CTypeID sid;
  CTInfo info_local;
  CPDecl *sdecl_local;
  CPState *cp_local;
  GCstr *local_10;
  
  cp->tmask = 0x2022;
  ct._4_4_ = info;
  _sid = sdecl;
  sdecl_local = (CPDecl *)cp;
  cp_next(cp);
  cp_decl_attributes((CPState *)sdecl_local,_sid);
  sdecl_local->stack[2].info = 0x38c0;
  if (sdecl_local->pos == 0x7b) {
    ct._0_4_ = lj_ctype_new((CTState *)sdecl_local->stack[0].name.gcptr64,(CType **)&local_38);
    *(CTInfo *)&(local_38->nextgc).gcptr64 = ct._4_4_;
    *(CTSize *)((long)&(local_38->nextgc).gcptr64 + 4) = 0xffffffff;
  }
  else {
    if (sdecl_local->pos != 0x100) {
      cp_err_token((CPState *)sdecl_local,0x100);
    }
    if (sdecl_local->mode == 0) {
      if ((sdecl_local->stack[2].size & 0x10) != 0) {
        cp_errmsg((CPState *)sdecl_local,0,LJ_ERR_FFI_BADTAG,&sdecl_local->cp->ct);
      }
      ct._0_4_ = lj_ctype_new((CTState *)sdecl_local->stack[0].name.gcptr64,(CType **)&local_38);
      *(CTInfo *)&(local_38->nextgc).gcptr64 = ct._4_4_;
      *(CTSize *)((long)&(local_38->nextgc).gcptr64 + 4) = 0xffffffff;
      cp_local = sdecl_local->cp;
      local_10 = local_38;
      *(byte *)&(cp_local->val).field_0 = *(byte *)&(cp_local->val).field_0 | 0x20;
      ((GCRef *)&local_38->hash)->gcptr64 = (uint64_t)cp_local;
      lj_ctype_addname((CTState *)sdecl_local->stack[0].name.gcptr64,(CType *)local_38,(CTypeID)ct);
    }
    else {
      ct._0_4_ = sdecl_local->mode;
      local_38 = sdecl_local->name;
      if ((((uint)(local_38->nextgc).gcptr64 ^ ct._4_4_) & 0xf0800000) != 0) {
        cp_errmsg((CPState *)sdecl_local,0,LJ_ERR_FFI_REDEF,
                  ((GCRef *)&local_38->hash)->gcptr64 + 0x18);
      }
    }
    cp_next((CPState *)sdecl_local);
  }
  if (sdecl_local->pos == 0x7b) {
    if ((*(CTSize *)((long)&(local_38->nextgc).gcptr64 + 4) != 0xffffffff) ||
       (*(CTypeID1 *)&local_38->marked != 0)) {
      cp_errmsg((CPState *)sdecl_local,0,LJ_ERR_FFI_REDEF,((GCRef *)&local_38->hash)->gcptr64 + 0x18
               );
    }
    *(CTypeID1 *)&local_38->marked = 1;
  }
  return (CTypeID)ct;
}

Assistant:

static CTypeID cp_struct_name(CPState *cp, CPDecl *sdecl, CTInfo info)
{
  CTypeID sid;
  CType *ct;
  cp->tmask = CPNS_STRUCT;
  cp_next(cp);
  cp_decl_attributes(cp, sdecl);
  cp->tmask = CPNS_DEFAULT;
  if (cp->tok != '{') {
    if (cp->tok != CTOK_IDENT) cp_err_token(cp, CTOK_IDENT);
    if (cp->val.id) {  /* Name of existing struct/union/enum. */
      sid = cp->val.id;
      ct = cp->ct;
      if ((ct->info ^ info) & (CTMASK_NUM|CTF_UNION))  /* Wrong type. */
	cp_errmsg(cp, 0, LJ_ERR_FFI_REDEF, strdata(gco2str(gcref(ct->name))));
    } else {  /* Create named, incomplete struct/union/enum. */
      if ((cp->mode & CPARSE_MODE_NOIMPLICIT))
	cp_errmsg(cp, 0, LJ_ERR_FFI_BADTAG, strdata(cp->str));
      sid = lj_ctype_new(cp->cts, &ct);
      ct->info = info;
      ct->size = CTSIZE_INVALID;
      ctype_setname(ct, cp->str);
      lj_ctype_addname(cp->cts, ct, sid);
    }
    cp_next(cp);
  } else {  /* Create anonymous, incomplete struct/union/enum. */
    sid = lj_ctype_new(cp->cts, &ct);
    ct->info = info;
    ct->size = CTSIZE_INVALID;
  }
  if (cp->tok == '{') {
    if (ct->size != CTSIZE_INVALID || ct->sib)
      cp_errmsg(cp, 0, LJ_ERR_FFI_REDEF, strdata(gco2str(gcref(ct->name))));
    ct->sib = 1;  /* Indicate the type is currently being defined. */
  }
  return sid;
}